

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::base_html_input::base_html_input(base_html_input *this,void **vtt,string *type)

{
  string *in_RDX;
  long *in_RSI;
  long *in_RDI;
  
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = in_RSI[1];
  booster::hold_ptr<cppcms::widgets::base_html_input::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::base_html_input::_data> *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  return;
}

Assistant:

base_html_input::base_html_input(std::string const &type) : type_(type) {}